

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::IfExpr::IfExpr
          (IfExpr *this,Lexer *lexer,Position *pos,
          vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
          *ifCases,unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *elseExpr,
          bool isensure)

{
  bool bVar1;
  reference __t;
  __tuple_element_t<0UL,_tuple<unique_ptr<Expr,_default_delete<Expr>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *this_00;
  pointer this_01;
  __tuple_element_t<1UL,_tuple<unique_ptr<Expr,_default_delete<Expr>_>,_unique_ptr<BodyExpr,_default_delete<BodyExpr>_>_>_>
  *this_02;
  pointer this_03;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  *ifcase;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  *__range1;
  bool isensure_local;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *elseExpr_local;
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  *ifCases_local;
  Position *pos_local;
  Lexer *lexer_local;
  IfExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_IF,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__IfExpr_00176920;
  std::
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::vector(&this->ifCases,ifCases);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::unique_ptr
            (&this->elseExpr,elseExpr);
  this->isensure = isensure;
  bVar1 = std::
          vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
          ::empty(&this->ifCases);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->ifCases.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x268,
                  "pfederc::IfExpr::IfExpr(const Lexer &, const Position &, std::vector<IfCase> &&, std::unique_ptr<BodyExpr> &&, bool)"
                 );
  }
  __end1 = std::
           vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ::begin(&this->ifCases);
  ifcase = (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
            *)std::
              vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
              ::end(&this->ifCases);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
                                *)&ifcase);
    if (!bVar1) break;
    __t = __gnu_cxx::
          __normal_iterator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
          ::operator*(&__end1);
    this_00 = std::
              get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                        (__t);
    this_01 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                        (this_00);
    Expr::setParent(this_01,&this->super_Expr);
    this_02 = std::
              get<1ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                        (__t);
    this_03 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::
              operator->(this_02);
    Expr::setParent(&this_03->super_Expr,&this->super_Expr);
    __gnu_cxx::
    __normal_iterator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_*,_std::vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>_>
    ::operator++(&__end1);
  }
  _setParent<pfederc::BodyExpr>(&this->elseExpr,&this->super_Expr);
  return;
}

Assistant:

IfExpr::IfExpr(const Lexer &lexer, const Position &pos,
    std::vector<IfCase> &&ifCases,
    std::unique_ptr<BodyExpr> &&elseExpr, bool isensure) noexcept
    : Expr(lexer, ExprType::EXPR_IF, pos), ifCases(std::move(ifCases)),
      elseExpr(std::move(elseExpr)), isensure{isensure} {
  assert(!this->ifCases.empty());

  for (auto &ifcase : this->ifCases) {
    std::get<0>(ifcase)->setParent(this);
    std::get<1>(ifcase)->setParent(this);
  }

  _setParent(this->elseExpr, this);
}